

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportBaseDirWrapper.cpp
# Opt level: O3

QString * __thiscall
ImportBaseFuncWrapper::getShortName(QString *__return_storage_ptr__,ImportBaseFuncWrapper *this)

{
  _func_int **pp_Var1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  storage_type *psVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QString local_78;
  QString local_58;
  QArrayData *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  local_78.d.size = 0;
  iVar2 = (*(this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
            super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x31])(this);
  pp_Var1 = (this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
            super_AbstractByteBuffer._vptr_AbstractByteBuffer;
  if ((char)iVar2 == '\0') {
    iVar2 = (*pp_Var1[0x33])(this);
    if ((char *)CONCAT44(extraout_var_00,iVar2) == (char *)0x0) {
      QVar5.m_data = (storage_type *)0x0;
      QVar5.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar5);
      (__return_storage_ptr__->d).d = local_58.d.d;
      (__return_storage_ptr__->d).ptr = local_58.d.ptr;
      goto LAB_0012ed9a;
    }
    psVar3 = (storage_type *)strlen((char *)CONCAT44(extraout_var_00,iVar2));
    QVar4.m_data = psVar3;
    QVar4.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar4);
    local_78.d.d._0_4_ = local_58.d.d._0_4_;
    local_78.d.d._4_4_ = local_58.d.d._4_4_;
    local_78.d.ptr._0_4_ = local_58.d.ptr._0_4_;
    local_78.d.ptr._4_4_ = local_58.d.ptr._4_4_;
  }
  else {
    iVar2 = (*pp_Var1[0x32])();
    QString::asprintf((char *)&local_38,"<ord: %llX>",CONCAT44(extraout_var,iVar2));
    local_58.d.d = (Data *)local_38;
    local_58.d.ptr = pcStack_30;
    local_58.d.size = local_28;
    QString::operator=(&local_78,&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
      }
    }
    local_58.d.size = local_78.d.size;
  }
  *(undefined4 *)&(__return_storage_ptr__->d).d = local_78.d.d._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_78.d.d._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_78.d.ptr._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_78.d.ptr._4_4_;
LAB_0012ed9a:
  (__return_storage_ptr__->d).size = local_58.d.size;
  return __return_storage_ptr__;
}

Assistant:

QString ImportBaseFuncWrapper::getShortName()
{
    QString functionName;
    if (isByOrdinal()) {
        uint64_t val = getOrdinal();
        QString out;
#if QT_VERSION >= 0x050000
        out = QString::asprintf("<ord: %llX>", static_cast<unsigned long long>(val));
#else
        out.sprintf("<ord: %llX>", static_cast<unsigned long long>(val));
#endif
        functionName = out;
    } else {
        char *fName = this->getFunctionName();
        if (!fName) return "";
        functionName = fName;
    }
    return functionName;
}